

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_utils.h
# Opt level: O2

Form icu_63::number::impl::utils::getStandardPlural(PluralRules *rules,IFixedDecimal *fdec)

{
  Form FVar1;
  fd_set *in_RCX;
  fd_set *in_R8;
  timeval *in_R9;
  UnicodeString ruleString;
  
  if (rules == (PluralRules *)0x0) {
    FVar1 = OTHER;
  }
  else {
    PluralRules::select((PluralRules *)&ruleString,(int)rules,(fd_set *)fdec,in_RCX,in_R8,in_R9);
    FVar1 = StandardPlural::indexOrOtherIndexFromString(&ruleString);
    UnicodeString::~UnicodeString(&ruleString);
  }
  return FVar1;
}

Assistant:

inline StandardPlural::Form getStandardPlural(const PluralRules *rules,
                                              const IFixedDecimal &fdec) {
    if (rules == nullptr) {
        // Fail gracefully if the user didn't provide a PluralRules
        return StandardPlural::Form::OTHER;
    } else {
        UnicodeString ruleString = rules->select(fdec);
        return StandardPlural::orOtherFromString(ruleString);
    }
}